

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

StateVar * __thiscall
despot::Parser::CreateStateVar
          (StateVar *__return_storage_ptr__,Parser *this,TiXmlElement *e_StateVar)

{
  int iVar1;
  char *pcVar2;
  TiXmlNode *pTVar3;
  TiXmlElement *pTVar4;
  string value_enum_list;
  string curr_name;
  string prev_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values;
  string local_118;
  string local_f8;
  long *local_d8;
  long local_d0;
  long local_c8 [2];
  long *local_b8 [2];
  long local_a8 [2];
  string local_98;
  long *local_78 [2];
  long local_68 [2];
  long *local_58;
  long local_50;
  long local_48 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  StateVar::StateVar(__return_storage_ptr__);
  pcVar2 = util::tinyxml::TiXmlElement::Attribute(e_StateVar,"vnamePrev");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,pcVar2,(allocator<char> *)&local_d8);
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char*>((string *)local_b8,local_58,local_50 + (long)local_58);
  std::__cxx11::string::_M_assign((string *)&(__return_storage_ptr__->super_NamedVar).name_);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->prev_name_);
  if (local_b8[0] != local_a8) {
    operator_delete(local_b8[0],local_a8[0] + 1);
  }
  pcVar2 = util::tinyxml::TiXmlElement::Attribute(e_StateVar,"vnameCurr");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,pcVar2,(allocator<char> *)&local_118);
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char*>((string *)local_78,local_d8,local_d0 + (long)local_d8);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->curr_name_);
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  pcVar2 = util::tinyxml::TiXmlElement::Attribute(e_StateVar,"fullyObs");
  if (pcVar2 == (char *)0x0) {
    pcVar2 = "false";
  }
  else {
    pcVar2 = util::tinyxml::TiXmlElement::Attribute(e_StateVar,"fullyObs");
  }
  iVar1 = strcmp(pcVar2,"true");
  __return_storage_ptr__->observed_ = iVar1 == 0;
  pTVar3 = util::tinyxml::TiXmlNode::FirstChild(&e_StateVar->super_TiXmlNode,"ValueEnum");
  if (pTVar3 == (TiXmlNode *)0x0) {
    pTVar4 = util::tinyxml::TiXmlNode::FirstChildElement(&e_StateVar->super_TiXmlNode,"NumValues");
    pcVar2 = util::tinyxml::TiXmlElement::GetText(pTVar4);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,pcVar2,(allocator<char> *)&local_f8);
    iVar1 = atoi(local_118._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"s","");
    Variable::values((Variable *)__return_storage_ptr__,&local_98,iVar1);
    local_118._M_dataplus._M_p = local_98._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p == &local_98.field_2) goto LAB_0014e761;
  }
  else {
    pTVar4 = util::tinyxml::TiXmlNode::FirstChildElement(&e_StateVar->super_TiXmlNode,"ValueEnum");
    pcVar2 = util::tinyxml::TiXmlElement::GetText(pTVar4);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,pcVar2,(allocator<char> *)&local_f8);
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8," ","");
    Tokenize(&local_38,&local_118,&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    Variable::values((Variable *)__return_storage_ptr__,&local_38);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_38);
    local_98.field_2._M_allocated_capacity = local_118.field_2._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p == &local_118.field_2) goto LAB_0014e761;
  }
  operator_delete(local_118._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
LAB_0014e761:
  if (local_d8 != local_c8) {
    operator_delete(local_d8,local_c8[0] + 1);
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

StateVar Parser::CreateStateVar(TiXmlElement* e_StateVar) {
	StateVar state;

	// vnamePrev
	string prev_name = e_StateVar->Attribute("vnamePrev");
	state.prev_name(prev_name);

	// vnameCurr
	string curr_name = e_StateVar->Attribute("vnameCurr");
	state.curr_name(curr_name);

	// fullyObs
	const char* fully_observed;
	if (e_StateVar->Attribute("fullyObs"))
		fully_observed = e_StateVar->Attribute("fullyObs");
	else
		fully_observed = "false"; //default is false
	state.observed(strcmp(fully_observed, "true") == 0);

	// ValueEnum or NumValues
	if (e_StateVar->FirstChild("ValueEnum")) {
		string value_enum_list = GetFirstChildText(e_StateVar, "ValueEnum");
		vector<string> values = Tokenize(value_enum_list);
		state.values(values);
	} else {
		int num = atoi(GetFirstChildText(e_StateVar, "NumValues").c_str());
		state.values("s", num);
	}

	return state;
}